

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-validator.cpp
# Opt level: O1

void __thiscall wasm::FunctionValidator::visitRefNull(FunctionValidator *this,RefNull *curr)

{
  ulong uVar1;
  FeatureSet FVar2;
  ostringstream *poVar3;
  ostream *poVar4;
  FeatureSet feats;
  Type *this_00;
  bool bVar5;
  string local_60;
  Type *local_40;
  char local_31;
  
  this_00 = &(curr->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.type;
  FVar2 = wasm::Type::getFeatures(this_00);
  if ((this->
      super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
      ).super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
      super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>.
      currFunction == (Function *)0x0) {
    bVar5 = true;
  }
  else {
    bVar5 = (FVar2.features &
            ~(((this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
              .currModule)->features).features) == 0;
  }
  feats.features = 0xe596eb;
  bVar5 = ValidationInfo::shouldBeTrue<wasm::RefNull*>
                    (this->info,bVar5,curr,"ref.null requires additional features ",
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
  if (!bVar5) {
    local_40 = this_00;
    poVar3 = ValidationInfo::getStream_abi_cxx11_
                       (this->info,
                        (this->
                        super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                        ).
                        super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .
                        super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                        .currFunction);
    getMissingFeaturesList_abi_cxx11_
              (&local_60,
               (wasm *)(this->
                       super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                       ).
                       super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .
                       super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                       .currModule,(Module *)(ulong)FVar2.features,feats);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)poVar3,local_60._M_dataplus._M_p,local_60._M_string_length);
    local_31 = '\n';
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,&local_31,1);
    this_00 = local_40;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != &local_60.field_2) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      this_00 = local_40;
    }
  }
  uVar1 = (curr->super_SpecificExpression<(wasm::Expression::Id)41>).super_Expression.type.id;
  bVar5 = ValidationInfo::shouldBeTrue<wasm::RefNull*>
                    (this->info,((uint)uVar1 & 3) == 2 && 6 < uVar1,curr,
                     "ref.null types must be nullable",
                     (this->
                     super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
                     ).
                     super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .
                     super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
                     .currFunction);
  if (bVar5) {
    bVar5 = wasm::Type::isNull(this_00);
    ValidationInfo::shouldBeTrue<wasm::RefNull*>
              (this->info,bVar5,curr,"ref.null must have a bottom heap type",
               (this->
               super_WalkerPass<wasm::PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>_>
               ).
               super_PostWalker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .super_Walker<wasm::FunctionValidator,_wasm::Visitor<wasm::FunctionValidator,_void>_>
               .currFunction);
  }
  return;
}

Assistant:

void FunctionValidator::visitRefNull(RefNull* curr) {
  // If we are not in a function, this is a global location like a table. We
  // allow RefNull there as we represent tables that way regardless of what
  // features are enabled.
  auto feats = curr->type.getFeatures();
  if (!shouldBeTrue(!getFunction() || feats <= getModule()->features,
                    curr,
                    "ref.null requires additional features ")) {
    getStream() << getMissingFeaturesList(*getModule(), feats) << '\n';
  }
  if (!shouldBeTrue(
        curr->type.isNullable(), curr, "ref.null types must be nullable")) {
    return;
  }
  shouldBeTrue(
    curr->type.isNull(), curr, "ref.null must have a bottom heap type");
}